

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::tabChanged(QMainWindowLayout *this)

{
  QObject *object;
  QWidget *pQVar1;
  QDockAreaLayoutInfo *this_00;
  QDockWidget *_t1;
  QWidget *this_01;
  QDockWidgetGroupWindow *this_02;
  int __sig;
  
  object = (QObject *)QObject::sender();
  pQVar1 = &QtPrivate::qobject_cast_helper<QTabBar*,QObject>(object)->super_QWidget;
  if (pQVar1 != (QWidget *)0x0) {
    this_00 = dockInfo(this,pQVar1);
    if (this_00 != (QDockAreaLayoutInfo *)0x0) {
      __sig = 0;
      _t1 = QDockAreaLayoutInfo::apply(this_00,false);
      if (_t1 != (QDockWidget *)0x0) {
        this_01 = QLayout::parentWidget((QLayout *)this);
        QMainWindow::tabifiedDockWidgetActivated((QMainWindow *)this_01,_t1);
        __sig = (int)_t1;
      }
      this_02 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                          (*(QObject **)(*(long *)&pQVar1->field_0x8 + 0x10));
      if (this_02 != (QDockWidgetGroupWindow *)0x0) {
        QDockWidgetGroupWindow::adjustFlags((QDockWidgetGroupWindow *)this_02);
      }
      if (*(long **)(this + 0x1c0) != (long *)0x0) {
        pQVar1 = (QWidget *)(**(code **)(**(long **)(this + 0x1c0) + 0x68))();
        if (pQVar1 != (QWidget *)0x0) {
          QWidget::raise(pQVar1,__sig);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void QMainWindowLayout::tabChanged()
{
    QTabBar *tb = qobject_cast<QTabBar*>(sender());
    if (tb == nullptr)
        return;
    QDockAreaLayoutInfo *info = dockInfo(tb);
    if (info == nullptr)
        return;

    QDockWidget *activated = info->apply(false);

    if (activated)
        emit static_cast<QMainWindow *>(parentWidget())->tabifiedDockWidgetActivated(activated);

    if (auto dwgw = qobject_cast<QDockWidgetGroupWindow*>(tb->parentWidget()))
        dwgw->adjustFlags();

    if (QWidget *w = centralWidget())
        w->raise();
}